

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

CharIterator * __thiscall
absl::Cord::Find(CharIterator *__return_storage_ptr__,Cord *this,Cord *needle)

{
  CharIterator it;
  CharIterator position;
  CharIterator haystack;
  string_view needle_00;
  char *pcVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  size_type sVar5;
  long lVar6;
  CharIterator *pCVar7;
  undefined8 *puVar8;
  size_t *psVar9;
  undefined8 *puVar10;
  byte bVar11;
  size_t in_stack_fffffffffffff718;
  undefined1 in_stack_fffffffffffff720 [144];
  undefined1 auVar12 [112];
  CordRepBtree *in_stack_fffffffffffff7b0;
  ChunkIterator in_stack_fffffffffffff7b8;
  ChunkIterator in_stack_fffffffffffff850;
  bool local_6f1;
  undefined8 local_6c8 [19];
  CharIterator local_630;
  undefined8 local_598 [19];
  undefined8 local_500 [19];
  undefined1 local_468 [8];
  CharIterator needle_it;
  CharIterator haystack_advanced_it;
  undefined8 local_290 [19];
  CharIterator local_1f8;
  undefined1 local_160 [8];
  CharIterator haystack_it;
  undefined1 local_30 [8];
  string_view needle_chunk;
  size_t needle_size;
  Cord *needle_local;
  Cord *this_local;
  
  bVar11 = 0;
  bVar2 = empty(needle);
  if (bVar2) {
    char_begin(__return_storage_ptr__,this);
  }
  else {
    pcVar3 = (char *)size(needle);
    needle_chunk._M_str = pcVar3;
    pcVar4 = (char *)size(this);
    pcVar1 = needle_chunk._M_str;
    if (pcVar4 < pcVar3) {
      char_end(__return_storage_ptr__,this);
    }
    else {
      pcVar3 = (char *)size(this);
      if (pcVar1 == pcVar3) {
        bVar2 = absl::operator==(this,needle);
        if (bVar2) {
          char_begin(__return_storage_ptr__,this);
        }
        else {
          char_end(__return_storage_ptr__,this);
        }
      }
      else {
        char_begin((CharIterator *)
                   (haystack_it.chunk_iterator_.btree_reader_.navigator_.node_ + 0xb),needle);
        _local_30 = ChunkRemaining((CharIterator *)
                                   (haystack_it.chunk_iterator_.btree_reader_.navigator_.node_ + 0xb
                                   ));
        char_begin((CharIterator *)local_160,this);
        do {
          memcpy(local_290,local_160,0x98);
          needle_00 = _local_30;
          puVar8 = local_290;
          puVar10 = (undefined8 *)&stack0xfffffffffffff718;
          for (lVar6 = 0x13; lVar6 != 0; lVar6 = lVar6 + -1) {
            *puVar10 = *puVar8;
            puVar8 = puVar8 + (ulong)bVar11 * -2 + 1;
            puVar10 = puVar10 + (ulong)bVar11 * -2 + 1;
          }
          it.chunk_iterator_.current_chunk_._M_str = (char *)in_stack_fffffffffffff720._0_8_;
          it.chunk_iterator_.current_leaf_ =
               (Nullable<absl::cord_internal::CordRep_*>)in_stack_fffffffffffff720._8_8_;
          it.chunk_iterator_.bytes_remaining_ = in_stack_fffffffffffff720._16_8_;
          auVar12 = SUB120112(in_stack_fffffffffffff720._24_120_,8);
          it.chunk_iterator_.btree_reader_.remaining_ =
               SUB1208(in_stack_fffffffffffff720._24_120_,0);
          it.chunk_iterator_.btree_reader_.navigator_.height_ = auVar12._0_4_;
          it.chunk_iterator_.btree_reader_.navigator_.index_[0] = auVar12[4];
          it.chunk_iterator_.btree_reader_.navigator_.index_[1] = auVar12[5];
          it.chunk_iterator_.btree_reader_.navigator_.index_[2] = auVar12[6];
          it.chunk_iterator_.btree_reader_.navigator_.index_[3] = auVar12[7];
          it.chunk_iterator_.btree_reader_.navigator_.index_[4] = auVar12[8];
          it.chunk_iterator_.btree_reader_.navigator_.index_[5] = auVar12[9];
          it.chunk_iterator_.btree_reader_.navigator_.index_[6] = auVar12[10];
          it.chunk_iterator_.btree_reader_.navigator_.index_[7] = auVar12[0xb];
          it.chunk_iterator_.btree_reader_.navigator_.index_[8] = auVar12[0xc];
          it.chunk_iterator_.btree_reader_.navigator_.index_[9] = auVar12[0xd];
          it.chunk_iterator_.btree_reader_.navigator_.index_[10] = auVar12[0xe];
          it.chunk_iterator_.btree_reader_.navigator_.index_[0xb] = auVar12[0xf];
          it.chunk_iterator_.btree_reader_.navigator_.node_[0] = (CordRepBtree *)auVar12._16_8_;
          it.chunk_iterator_.btree_reader_.navigator_.node_[1] = (CordRepBtree *)auVar12._24_8_;
          it.chunk_iterator_.btree_reader_.navigator_.node_[2] = (CordRepBtree *)auVar12._32_8_;
          it.chunk_iterator_.btree_reader_.navigator_.node_[3] = (CordRepBtree *)auVar12._40_8_;
          it.chunk_iterator_.btree_reader_.navigator_.node_[4] = (CordRepBtree *)auVar12._48_8_;
          it.chunk_iterator_.btree_reader_.navigator_.node_[5] = (CordRepBtree *)auVar12._56_8_;
          it.chunk_iterator_.btree_reader_.navigator_.node_[6] = (CordRepBtree *)auVar12._64_8_;
          it.chunk_iterator_.btree_reader_.navigator_.node_[7] = (CordRepBtree *)auVar12._72_8_;
          it.chunk_iterator_.btree_reader_.navigator_.node_[8] = (CordRepBtree *)auVar12._80_8_;
          it.chunk_iterator_.btree_reader_.navigator_.node_[9] = (CordRepBtree *)auVar12._88_8_;
          it.chunk_iterator_.btree_reader_.navigator_.node_[10] = (CordRepBtree *)auVar12._96_8_;
          it.chunk_iterator_.btree_reader_.navigator_.node_[0xb] = (CordRepBtree *)auVar12._104_8_;
          it.chunk_iterator_.current_chunk_._M_len = in_stack_fffffffffffff718;
          FindImpl(&local_1f8,this,it,needle_00);
          memcpy(local_160,&local_1f8,0x98);
          char_end((CharIterator *)
                   (haystack_advanced_it.chunk_iterator_.btree_reader_.navigator_.node_ + 0xb),this)
          ;
          local_6f1 = CharIterator::operator==
                                ((CharIterator *)local_160,
                                 (CharIterator *)
                                 (haystack_advanced_it.chunk_iterator_.btree_reader_.navigator_.
                                  node_ + 0xb));
          local_6f1 = local_6f1 || haystack_it.chunk_iterator_.current_leaf_ < needle_chunk._M_str;
          if (local_6f1) goto LAB_00176d52;
          memcpy(needle_it.chunk_iterator_.btree_reader_.navigator_.node_ + 0xb,local_160,0x98);
          char_begin((CharIterator *)local_468,needle);
          sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                            ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
          Advance((Nonnull<CharIterator_*>)
                  (needle_it.chunk_iterator_.btree_reader_.navigator_.node_ + 0xb),sVar5);
          sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                            ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
          Advance((Nonnull<CharIterator_*>)local_468,sVar5);
          memcpy(local_500,needle_it.chunk_iterator_.btree_reader_.navigator_.node_ + 0xb,0x98);
          memcpy(local_598,local_468,0x98);
          char_end(&local_630,needle);
          puVar8 = local_500;
          puVar10 = (undefined8 *)&stack0xfffffffffffff718;
          for (lVar6 = 0x13; lVar6 != 0; lVar6 = lVar6 + -1) {
            *puVar10 = *puVar8;
            puVar8 = puVar8 + (ulong)bVar11 * -2 + 1;
            puVar10 = puVar10 + (ulong)bVar11 * -2 + 1;
          }
          pCVar7 = &local_630;
          psVar9 = (size_t *)&stack0xfffffffffffff848;
          for (lVar6 = 0x13; lVar6 != 0; lVar6 = lVar6 + -1) {
            *psVar9 = (pCVar7->chunk_iterator_).current_chunk_._M_len;
            pCVar7 = (CharIterator *)((long)pCVar7 + ((ulong)bVar11 * -2 + 1) * 8);
            psVar9 = psVar9 + (ulong)bVar11 * -2 + 1;
          }
          puVar8 = local_598;
          puVar10 = (undefined8 *)&stack0xfffffffffffff7b0;
          for (lVar6 = 0x13; lVar6 != 0; lVar6 = lVar6 + -1) {
            *puVar10 = *puVar8;
            puVar8 = puVar8 + (ulong)bVar11 * -2 + 1;
            puVar10 = puVar10 + (ulong)bVar11 * -2 + 1;
          }
          haystack.chunk_iterator_.btree_reader_.navigator_.node_[0xb] = in_stack_fffffffffffff7b0;
          haystack.chunk_iterator_.current_chunk_._M_len =
               SUB168(in_stack_fffffffffffff720._0_16_,0);
          haystack.chunk_iterator_.current_chunk_._M_str =
               (char *)SUB168(in_stack_fffffffffffff720._0_16_,8);
          haystack.chunk_iterator_.current_leaf_ =
               (Nullable<absl::cord_internal::CordRep_*>)in_stack_fffffffffffff720._16_8_;
          haystack.chunk_iterator_.bytes_remaining_ = in_stack_fffffffffffff720._24_8_;
          haystack.chunk_iterator_.btree_reader_.remaining_ = in_stack_fffffffffffff720._32_8_;
          haystack.chunk_iterator_.btree_reader_.navigator_.height_ =
               in_stack_fffffffffffff720._40_4_;
          haystack.chunk_iterator_.btree_reader_.navigator_.index_[0] =
               in_stack_fffffffffffff720[0x2c];
          haystack.chunk_iterator_.btree_reader_.navigator_.index_[1] =
               in_stack_fffffffffffff720[0x2d];
          haystack.chunk_iterator_.btree_reader_.navigator_.index_[2] =
               in_stack_fffffffffffff720[0x2e];
          haystack.chunk_iterator_.btree_reader_.navigator_.index_[3] =
               in_stack_fffffffffffff720[0x2f];
          haystack.chunk_iterator_.btree_reader_.navigator_.index_[4] =
               in_stack_fffffffffffff720[0x30];
          haystack.chunk_iterator_.btree_reader_.navigator_.index_[5] =
               in_stack_fffffffffffff720[0x31];
          haystack.chunk_iterator_.btree_reader_.navigator_.index_[6] =
               in_stack_fffffffffffff720[0x32];
          haystack.chunk_iterator_.btree_reader_.navigator_.index_[7] =
               in_stack_fffffffffffff720[0x33];
          haystack.chunk_iterator_.btree_reader_.navigator_.index_[8] =
               in_stack_fffffffffffff720[0x34];
          haystack.chunk_iterator_.btree_reader_.navigator_.index_[9] =
               in_stack_fffffffffffff720[0x35];
          haystack.chunk_iterator_.btree_reader_.navigator_.index_[10] =
               in_stack_fffffffffffff720[0x36];
          haystack.chunk_iterator_.btree_reader_.navigator_.index_[0xb] =
               in_stack_fffffffffffff720[0x37];
          haystack.chunk_iterator_.btree_reader_.navigator_.node_[0] =
               (CordRepBtree *)in_stack_fffffffffffff720._56_8_;
          haystack.chunk_iterator_.btree_reader_.navigator_.node_[1] =
               (CordRepBtree *)in_stack_fffffffffffff720._64_8_;
          haystack.chunk_iterator_.btree_reader_.navigator_.node_[2] =
               (CordRepBtree *)in_stack_fffffffffffff720._72_8_;
          haystack.chunk_iterator_.btree_reader_.navigator_.node_[3] =
               (CordRepBtree *)in_stack_fffffffffffff720._80_8_;
          haystack.chunk_iterator_.btree_reader_.navigator_.node_[4] =
               (CordRepBtree *)in_stack_fffffffffffff720._88_8_;
          haystack.chunk_iterator_.btree_reader_.navigator_.node_[5] =
               (CordRepBtree *)in_stack_fffffffffffff720._96_8_;
          haystack.chunk_iterator_.btree_reader_.navigator_.node_[6] =
               (CordRepBtree *)in_stack_fffffffffffff720._104_8_;
          haystack.chunk_iterator_.btree_reader_.navigator_.node_[7] =
               (CordRepBtree *)in_stack_fffffffffffff720._112_8_;
          haystack.chunk_iterator_.btree_reader_.navigator_.node_[8] =
               (CordRepBtree *)in_stack_fffffffffffff720._120_8_;
          haystack.chunk_iterator_.btree_reader_.navigator_.node_[9] =
               (CordRepBtree *)in_stack_fffffffffffff720._128_8_;
          haystack.chunk_iterator_.btree_reader_.navigator_.node_[10] =
               (CordRepBtree *)in_stack_fffffffffffff720._136_8_;
          bVar2 = anon_unknown_58::IsSubcordInCordAt
                            (haystack,(CharIterator)in_stack_fffffffffffff7b8,
                             (CharIterator)in_stack_fffffffffffff850);
          if (bVar2) {
            memcpy(__return_storage_ptr__,local_160,0x98);
            return __return_storage_ptr__;
          }
          Advance((Nonnull<CharIterator_*>)local_160,1);
          if (haystack_it.chunk_iterator_.current_leaf_ < needle_chunk._M_str) goto LAB_00176d52;
        } while (haystack_it.chunk_iterator_.current_leaf_ !=
                 (Nullable<absl::cord_internal::CordRep_*>)needle_chunk._M_str);
        memcpy(local_6c8,local_160,0x98);
        puVar8 = local_6c8;
        puVar10 = (undefined8 *)&stack0xfffffffffffff718;
        for (lVar6 = 0x13; lVar6 != 0; lVar6 = lVar6 + -1) {
          *puVar10 = *puVar8;
          puVar8 = puVar8 + (ulong)bVar11 * -2 + 1;
          puVar10 = puVar10 + (ulong)bVar11 * -2 + 1;
        }
        position.chunk_iterator_.current_chunk_._M_str = (char *)in_stack_fffffffffffff720._0_8_;
        position.chunk_iterator_.current_leaf_ =
             (Nullable<absl::cord_internal::CordRep_*>)in_stack_fffffffffffff720._8_8_;
        position.chunk_iterator_.bytes_remaining_ = in_stack_fffffffffffff720._16_8_;
        auVar12 = SUB120112(in_stack_fffffffffffff720._24_120_,8);
        position.chunk_iterator_.btree_reader_.remaining_ =
             SUB1208(in_stack_fffffffffffff720._24_120_,0);
        position.chunk_iterator_.btree_reader_.navigator_.height_ = auVar12._0_4_;
        position.chunk_iterator_.btree_reader_.navigator_.index_[0] = auVar12[4];
        position.chunk_iterator_.btree_reader_.navigator_.index_[1] = auVar12[5];
        position.chunk_iterator_.btree_reader_.navigator_.index_[2] = auVar12[6];
        position.chunk_iterator_.btree_reader_.navigator_.index_[3] = auVar12[7];
        position.chunk_iterator_.btree_reader_.navigator_.index_[4] = auVar12[8];
        position.chunk_iterator_.btree_reader_.navigator_.index_[5] = auVar12[9];
        position.chunk_iterator_.btree_reader_.navigator_.index_[6] = auVar12[10];
        position.chunk_iterator_.btree_reader_.navigator_.index_[7] = auVar12[0xb];
        position.chunk_iterator_.btree_reader_.navigator_.index_[8] = auVar12[0xc];
        position.chunk_iterator_.btree_reader_.navigator_.index_[9] = auVar12[0xd];
        position.chunk_iterator_.btree_reader_.navigator_.index_[10] = auVar12[0xe];
        position.chunk_iterator_.btree_reader_.navigator_.index_[0xb] = auVar12[0xf];
        position.chunk_iterator_.btree_reader_.navigator_.node_[0] = (CordRepBtree *)auVar12._16_8_;
        position.chunk_iterator_.btree_reader_.navigator_.node_[1] = (CordRepBtree *)auVar12._24_8_;
        position.chunk_iterator_.btree_reader_.navigator_.node_[2] = (CordRepBtree *)auVar12._32_8_;
        position.chunk_iterator_.btree_reader_.navigator_.node_[3] = (CordRepBtree *)auVar12._40_8_;
        position.chunk_iterator_.btree_reader_.navigator_.node_[4] = (CordRepBtree *)auVar12._48_8_;
        position.chunk_iterator_.btree_reader_.navigator_.node_[5] = (CordRepBtree *)auVar12._56_8_;
        position.chunk_iterator_.btree_reader_.navigator_.node_[6] = (CordRepBtree *)auVar12._64_8_;
        position.chunk_iterator_.btree_reader_.navigator_.node_[7] = (CordRepBtree *)auVar12._72_8_;
        position.chunk_iterator_.btree_reader_.navigator_.node_[8] = (CordRepBtree *)auVar12._80_8_;
        position.chunk_iterator_.btree_reader_.navigator_.node_[9] = (CordRepBtree *)auVar12._88_8_;
        position.chunk_iterator_.btree_reader_.navigator_.node_[10] = (CordRepBtree *)auVar12._96_8_
        ;
        position.chunk_iterator_.btree_reader_.navigator_.node_[0xb] =
             (CordRepBtree *)auVar12._104_8_;
        position.chunk_iterator_.current_chunk_._M_len = in_stack_fffffffffffff718;
        bVar2 = anon_unknown_58::IsSubcordInCordAt(position,needle);
        if (bVar2) {
          memcpy(__return_storage_ptr__,local_160,0x98);
        }
        else {
LAB_00176d52:
          char_end(__return_storage_ptr__,this);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

absl::Cord::CharIterator absl::Cord::Find(const absl::Cord& needle) const {
  if (needle.empty()) {
    return char_begin();
  }
  const auto needle_size = needle.size();
  if (needle_size > size()) {
    return char_end();
  }
  if (needle_size == size()) {
    return *this == needle ? char_begin() : char_end();
  }
  const auto needle_chunk = Cord::ChunkRemaining(needle.char_begin());
  auto haystack_it = char_begin();
  while (true) {
    haystack_it = FindImpl(haystack_it, needle_chunk);
    if (haystack_it == char_end() ||
        haystack_it.chunk_iterator_.bytes_remaining_ < needle_size) {
      break;
    }
    // We found the first chunk of `needle` at `haystack_it` but not the entire
    // subcord. Advance past the first chunk and check for the remainder.
    auto haystack_advanced_it = haystack_it;
    auto needle_it = needle.char_begin();
    Cord::Advance(&haystack_advanced_it, needle_chunk.size());
    Cord::Advance(&needle_it, needle_chunk.size());
    if (IsSubcordInCordAt(haystack_advanced_it, needle_it, needle.char_end())) {
      return haystack_it;
    }
    Cord::Advance(&haystack_it, 1);
    if (haystack_it.chunk_iterator_.bytes_remaining_ < needle_size) {
      break;
    }
    if (haystack_it.chunk_iterator_.bytes_remaining_ == needle_size) {
      // Special case, if there is exactly `needle_size` bytes remaining, the
      // subcord is either at `haystack_it` or not at all.
      if (IsSubcordInCordAt(haystack_it, needle)) {
        return haystack_it;
      }
      break;
    }
  }
  return char_end();
}